

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  float fVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  undefined7 in_register_00000009;
  uint uVar9;
  bool bVar10;
  byte *pbVar11;
  uint uVar12;
  long lVar13;
  byte *pbVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  double dVar21;
  int local_64;
  
  *pResult = 0.0;
  uVar15 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar15 == 1) {
    lVar13 = (long)length;
    uVar12 = 1;
    lVar20 = 1;
    pbVar11 = (byte *)z;
  }
  else {
    iVar8 = 3 - uVar15;
    uVar12 = 1;
    if (iVar8 < length) {
      lVar13 = (long)(int)(3 - uVar15);
      do {
        pcVar1 = z + lVar13;
        if (*pcVar1 != '\0') break;
        lVar13 = lVar13 + 2;
      } while (lVar13 < length);
      iVar8 = (int)lVar13;
      uVar12 = (uint)(*pcVar1 == '\0');
    }
    lVar13 = (ulong)enc + (long)iVar8 + -3;
    pbVar11 = (byte *)(z + (uVar15 & 1));
    lVar20 = 2;
  }
  pbVar14 = (byte *)(z + lVar13);
  while( true ) {
    if (pbVar14 <= pbVar11) {
      return 0;
    }
    bVar2 = *pbVar11;
    if ((""[bVar2] & 1) == 0) break;
    pbVar11 = pbVar11 + lVar20;
  }
  iVar8 = 0;
  lVar13 = 0;
  if ((bVar2 - 0x2b & 0xfd) == 0) {
    lVar13 = lVar20;
  }
  pbVar11 = pbVar11 + lVar13;
  if (pbVar11 < pbVar14) {
    iVar8 = 0;
    do {
      if (*pbVar11 != 0x30) break;
      pbVar11 = pbVar11 + lVar20;
      iVar8 = iVar8 + 1;
    } while (pbVar11 < pbVar14);
  }
  iVar6 = 0;
  if (pbVar11 < pbVar14) {
    lVar13 = 0;
    do {
      if ((9 < (ulong)*pbVar11 - 0x30) || (0xcccccccccccccca < lVar13)) break;
      lVar13 = (long)(char)*pbVar11 + lVar13 * 10 + -0x30;
      pbVar11 = pbVar11 + lVar20;
      iVar8 = iVar8 + 1;
    } while (pbVar11 < pbVar14);
  }
  else {
    lVar13 = 0;
  }
  local_64 = 1;
  if (pbVar11 < pbVar14) {
    iVar6 = 0;
LAB_00136b50:
    if (0xfffffffffffffff5 < (ulong)*pbVar11 - 0x3a) goto code_r0x00136b62;
    iVar8 = iVar8 + iVar6;
    if (*pbVar11 == 0x2e) {
      for (; ((pbVar11 = pbVar11 + lVar20, pbVar11 < pbVar14 && ((ulong)*pbVar11 - 0x30 < 10)) &&
             (lVar13 < 0xccccccccccccccb)); lVar13 = (long)(char)*pbVar11 + lVar13 * 10 + -0x30) {
        iVar8 = iVar8 + 1;
        iVar6 = iVar6 + -1;
      }
      for (; (pbVar11 < pbVar14 && (0xfffffffffffffff5 < (ulong)*pbVar11 - 0x3a));
          pbVar11 = pbVar11 + lVar20) {
        iVar8 = iVar8 + 1;
      }
    }
    if (pbVar14 <= pbVar11) goto LAB_00136b71;
    bVar5 = 1;
    if ((*pbVar11 | 0x20) == 0x65) {
      pbVar11 = pbVar11 + lVar20;
      iVar16 = 0;
      local_64 = 1;
      if (pbVar11 < pbVar14) {
        if (*pbVar11 == 0x2b) {
          pbVar11 = pbVar11 + lVar20;
        }
        else if (*pbVar11 == 0x2d) {
          pbVar11 = pbVar11 + lVar20;
          local_64 = -1;
        }
        if (pbVar11 < pbVar14) {
          uVar7 = (ulong)*pbVar11;
          iVar16 = 0;
          if (uVar7 - 0x3a < 0xfffffffffffffff6) {
            bVar5 = 0;
            bVar10 = false;
          }
          else {
            iVar17 = 0;
            do {
              pbVar11 = pbVar11 + lVar20;
              iVar16 = (char)uVar7 + -0x30 + iVar17 * 10;
              if (9999 < iVar17) {
                iVar16 = 10000;
              }
              bVar10 = true;
            } while ((pbVar11 < pbVar14) &&
                    (uVar7 = (ulong)*pbVar11, iVar17 = iVar16, 0xfffffffffffffff5 < uVar7 - 0x3a));
            bVar5 = 1;
          }
          goto LAB_00136e99;
        }
      }
      bVar10 = false;
    }
    else {
      iVar16 = 0;
      local_64 = 1;
      bVar10 = true;
LAB_00136e99:
      if (!(bool)(bVar5 ^ 1 | iVar8 == 0)) {
        while ((bVar10 = true, pbVar11 < pbVar14 && (bVar10 = true, (""[*pbVar11] & 1) != 0))) {
          pbVar11 = pbVar11 + lVar20;
        }
      }
    }
    goto LAB_00136b76;
  }
LAB_00136b71:
  iVar16 = 0;
  bVar10 = true;
LAB_00136b76:
  if (lVar13 == 0) {
    if (iVar8 == 0) {
      dVar21 = 0.0;
    }
    else {
      dVar21 = -0.0;
    }
    if (bVar2 != 0x2d) {
      dVar21 = 0.0;
    }
    goto LAB_00136eec;
  }
  uVar15 = iVar16 * local_64 + iVar6;
  if ((int)uVar15 < 0) {
    uVar18 = -uVar15;
    uVar7 = lVar13 * -0x3333333333333333 + 0x1999999999999998;
    if ((uVar7 >> 1 | (ulong)((uVar7 & 1) != 0) << 0x3f) < 0x1999999999999999) {
      do {
        uVar9 = uVar18 - 1;
        lVar13 = lVar13 / 10;
        uVar7 = lVar13 * -0x3333333333333333 + 0x1999999999999998;
        if (0x1999999999999998 < (uVar7 >> 1 | (ulong)((uVar7 & 1) != 0) << 0x3f)) break;
        bVar3 = 1 < uVar18;
        uVar18 = uVar9;
      } while (bVar3);
      goto LAB_00136ce6;
    }
    lVar20 = -lVar13;
    if (bVar2 != 0x2d) {
      lVar20 = lVar13;
    }
  }
  else {
    uVar9 = uVar15;
    if ((lVar13 < 0xccccccccccccccc) && (lVar20 = lVar13, uVar18 = uVar15, uVar15 != 0)) {
      do {
        uVar9 = uVar18 - 1;
        lVar13 = lVar20 * 10;
        if (0x147ae147ae147ad < lVar20) break;
        bVar3 = 1 < uVar18;
        lVar20 = lVar13;
        uVar18 = uVar9;
      } while (bVar3);
    }
LAB_00136ce6:
    uVar18 = uVar9;
    lVar20 = -lVar13;
    if (bVar2 != 0x2d) {
      lVar20 = lVar13;
    }
    if (uVar18 == 0) {
      dVar21 = (double)lVar20;
      goto LAB_00136eec;
    }
  }
  if (uVar18 - 0x134 < 0x22) {
    fVar4 = 1.0;
    if (uVar18 != 0x134) {
      fVar4 = 1.0;
      do {
        uVar18 = uVar18 - 1;
        fVar4 = fVar4 * 10.0;
      } while (0xd4c77a < (uVar18 * 0x3f2b3885 + 0x1a98ef4 >> 2 | uVar18 * 0x40000000));
    }
    if ((int)uVar15 < 0) {
      dVar21 = (double)((float)lVar20 / fVar4) / 1e+308;
    }
    else {
      dVar21 = (double)((float)lVar20 * fVar4) * 1e+308;
    }
    goto LAB_00136eec;
  }
  if (0x155 < uVar18) {
    if ((int)uVar15 < 0) {
      dVar21 = (double)((ulong)(double)lVar20 & 0x8000000000000000);
    }
    else {
      dVar21 = (double)lVar20 * INFINITY;
    }
    goto LAB_00136eec;
  }
  fVar4 = 1.0;
  if ((ushort)((ushort)(uVar18 * -0x745d) >> 1 | (ushort)((uVar18 * -0x745d & 1) != 0) << 0xf) <
      0xba3) {
LAB_00136df6:
    uVar18 = uVar18 + 0x16;
    do {
      fVar4 = fVar4 * 1e+22;
      uVar18 = uVar18 - 0x16;
    } while (0x16 < uVar18);
  }
  else {
    fVar4 = 1.0;
    do {
      uVar19 = uVar18;
      fVar4 = fVar4 * 10.0;
      uVar18 = uVar19 - 1;
      uVar9 = uVar19 * -0x45d1745d + 0x51745d17;
    } while (0xba2e8ba < (uVar9 >> 1 | (uint)((uVar9 & 1) != 0) << 0x1f));
    if (1 < (int)uVar19) goto LAB_00136df6;
  }
  if ((int)uVar15 < 0) {
    dVar21 = (double)((float)lVar20 / fVar4);
  }
  else {
    dVar21 = (double)((float)lVar20 * fVar4);
  }
LAB_00136eec:
  if (iVar8 < 1) {
    uVar12 = 0;
  }
  *pResult = dVar21;
  if (pbVar11 < pbVar14) {
    uVar12 = 0;
  }
  if (!bVar10) {
    uVar12 = 0;
  }
  return uVar12;
code_r0x00136b62:
  pbVar11 = pbVar11 + lVar20;
  iVar6 = iVar6 + 1;
  if (pbVar14 <= pbVar11) goto code_r0x00136b6c;
  goto LAB_00136b50;
code_r0x00136b6c:
  iVar8 = iVar8 + iVar6;
  goto LAB_00136b71;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigits = 0;
  int nonNum = 0;

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = z+i+enc-3;
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* skip leading zeroes */
  while( z<zEnd && z[0]=='0' ) z+=incr, nDigits++;

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
    s = s*10 + (*z - '0');
    z+=incr, nDigits++;
  }

  /* skip non-significant significand digits
  ** (increase exponent by d to shift decimal left) */
  while( z<zEnd && sqlite3Isdigit(*z) ) z+=incr, nDigits++, d++;
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
      s = s*10 + (*z - '0');
      z+=incr, nDigits++, d--;
    }
    /* skip non-significant digits */
    while( z<zEnd && sqlite3Isdigit(*z) ) z+=incr, nDigits++;
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    if( z>=zEnd ) goto do_atof_calc;
    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  if( nDigits && eValid ){
    while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  }

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  /* if 0 significand */
  if( !s ) {
    /* In the IEEE 754 standard, zero is signed.
    ** Add the sign if we've seen at least one digit */
    result = (sign<0 && nDigits) ? -(double)0 : (double)0;
  } else {
    /* attempt to reduce exponent */
    if( esign>0 ){
      while( s<(LARGEST_INT64/10) && e>0 ) e--,s*=10;
    }else{
      while( !(s%10) && e>0 ) e--,s/=10;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    /* if exponent, scale significand as appropriate
    ** and store in result. */
    if( e ){
      LONGDOUBLE_TYPE scale = 1.0;
      /* attempt to handle extremely small/large numbers better */
      if( e>307 && e<342 ){
        while( e%308 ) { scale *= 1.0e+1; e -= 1; }
        if( esign<0 ){
          result = s / scale;
          result /= 1.0e+308;
        }else{
          result = s * scale;
          result *= 1.0e+308;
        }
      }else if( e>=342 ){
        if( esign<0 ){
          result = 0.0*s;
        }else{
          result = 1e308*1e308*s;  /* Infinity */
        }
      }else{
        /* 1.0e+22 is the largest power of 10 than can be 
        ** represented exactly. */
        while( e%22 ) { scale *= 1.0e+1; e -= 1; }
        while( e>0 ) { scale *= 1.0e+22; e -= 22; }
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    } else {
      result = (double)s;
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  return z>=zEnd && nDigits>0 && eValid && nonNum==0;
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}